

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

_Bool remove_file(char *filename)

{
  int iVar1;
  char *filename_local;
  
  if (filename != (char *)0x0) {
    if (filename == (char *)0x0) {
      filename_local._7_1_ = false;
    }
    else {
      iVar1 = unlink(filename);
      if (iVar1 == 0) {
        filename_local._7_1_ = true;
      }
      else {
        perror("unlink");
        filename_local._7_1_ = false;
      }
    }
    return filename_local._7_1_;
  }
  __assert_fail("filename",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/rosmanov[P]bee-host/src/io.c"
                ,0x147,"_Bool remove_file(const char *)");
}

Assistant:

bool
remove_file (const char* filename)
{
  assert (filename);
  if (unlikely (filename == NULL))
    return false;

  if (unlikely (unlink (filename)))
    {
      perror ("unlink");
      return false;
    }

  return true;
}